

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

void __thiscall JSONNode::JSONNode(JSONNode *this,char mytype)

{
  internalJSONNode *piVar1;
  size_t *psVar2;
  allocator local_31;
  json_string local_30;
  
  piVar1 = internalJSONNode::newInternal(mytype);
  this->internal = piVar1;
  std::__cxx11::string::string((string *)&local_30,"Not a proper JSON type",&local_31);
  JSONDebug::_JSON_ASSERT((byte)mytype < 6,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  psVar2 = getCtorCounter();
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

inline JSONNode::JSONNode(char mytype) json_nothrow : internal(internalJSONNode::newInternal(mytype)){
    JSON_ASSERT((mytype == JSON_NULL) ||
			 (mytype == JSON_STRING) ||
			 (mytype == JSON_NUMBER) ||
			 (mytype == JSON_BOOL) ||
			 (mytype == JSON_ARRAY) ||
			 (mytype == JSON_NODE), JSON_TEXT("Not a proper JSON type"));
    LIBJSON_CTOR;
}